

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
 __thiscall ninx::parser::Parser::parse_if_statement(Parser *this)

{
  TokenReader *this_00;
  __node_base _Var1;
  int iVar2;
  IfCase *pIVar3;
  IfStatement *this_01;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> _Var4;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  cases;
  __single_object *if_condition;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_b0;
  undefined1 local_a8 [40];
  _Head_base<0UL,_ninx::parser::element::IfCase_*,_false> local_80;
  _Alloc_hider local_78;
  _Head_base<0UL,_ninx::parser::element::IfCase_*,_false> local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *local_48;
  _Alloc_hider local_40;
  _Head_base<0UL,_ninx::parser::element::IfStatement_*,_false> local_38;
  
  this_00 = &in_RSI->reader;
  local_38._M_head_impl = (IfStatement *)this;
  iVar2 = TokenReader::check_type(this_00,IF);
  if (iVar2 == 1) {
    TokenReader::get_token(this_00);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48 = (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                *)0x0;
    parse_level_3_expression((Parser *)(local_68 + 8));
    parse_block((Parser *)local_68);
    pIVar3 = (IfCase *)operator_new(0x28);
    local_a8._0_8_ = local_68._8_8_;
    local_68._8_8_ = 0;
    local_b0._M_head_impl = (Block *)local_68._0_8_;
    local_68._0_8_ = (pointer)0x0;
    element::IfCase::IfCase
              (pIVar3,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                       *)local_a8,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_b0);
    local_70._M_head_impl = pIVar3;
    if (local_b0._M_head_impl != (Block *)0x0) {
      (*((local_b0._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
        _vptr_ASTElement[1])();
    }
    local_b0._M_head_impl = (Block *)0x0;
    if ((_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
         )local_a8._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
              ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
                *)local_58._M_local_buf,
               (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                *)&local_70);
    while( true ) {
      iVar2 = TokenReader::check_type(this_00,ELSEIF);
      if (iVar2 != 1) break;
      TokenReader::get_token(this_00);
      parse_level_3_expression((Parser *)&local_78);
      parse_block((Parser *)&stack0xffffffffffffffc0);
      pIVar3 = (IfCase *)operator_new(0x28);
      local_a8._0_8_ = local_78._M_p;
      local_78._M_p = (pointer)0x0;
      local_b0._M_head_impl = (Block *)local_40._M_p;
      element::IfCase::IfCase
                (pIVar3,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                         *)local_a8,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&local_b0);
      local_80._M_head_impl = pIVar3;
      if (local_b0._M_head_impl != (Block *)0x0) {
        (*((local_b0._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
          _vptr_ASTElement[1])();
      }
      local_b0._M_head_impl = (Block *)0x0;
      if ((_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           )local_a8._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_a8._0_8_ + 8))();
      }
      std::
      vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
                ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
                  *)local_58._M_local_buf,
                 (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                  *)&local_80);
      if (local_80._M_head_impl != (IfCase *)0x0) {
        (*((local_80._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
      }
    }
    iVar2 = TokenReader::check_type(this_00,ELSE);
    if (iVar2 == 1) {
      TokenReader::get_token(this_00);
      parse_block((Parser *)local_a8);
      _Var4._M_head_impl = (Expression *)local_a8._0_8_;
    }
    else {
      _Var4._M_head_impl = (Expression *)0x0;
    }
    this_01 = (IfStatement *)operator_new(0x38);
    local_a8._0_8_ = local_58._M_allocated_capacity;
    local_a8._8_8_ = local_58._8_8_;
    local_a8._16_8_ = local_48;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48 = (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                *)0x0;
    local_b0._M_head_impl = (Block *)_Var4._M_head_impl;
    element::IfStatement::IfStatement
              (this_01,(vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                        *)local_a8,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_b0);
    _Var1._M_nxt = (_Hash_node_base *)local_38._M_head_impl;
    ((_Hash_node_base *)local_38._M_head_impl)->_M_nxt = (_Hash_node_base *)this_01;
    if (local_b0._M_head_impl != (Block *)0x0) {
      (*((local_b0._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
        _vptr_ASTElement[1])();
    }
    local_b0._M_head_impl = (Block *)0x0;
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ::~vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
               *)local_a8);
    if (local_70._M_head_impl != (IfCase *)0x0) {
      (*((local_70._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
    }
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ::~vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
               *)&local_58);
    return (unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
            )(IfStatement *)_Var1._M_nxt;
  }
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Expected If statement","");
  generate_exception(in_RSI,(string *)local_a8);
  if (local_70._M_head_impl != (IfCase *)0x0) {
    (*((local_70._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
  }
  if ((Expression *)local_68._8_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_68._8_8_ + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
             *)&local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<IfStatement> ninx::parser::Parser::parse_if_statement() {
    if (reader.check_type(Type::IF) != 1) {
        generate_exception("Expected If statement");
    }
    reader.get_token();

    std::vector<std::unique_ptr<IfCase>> cases;

    // Parse the main condition
    auto condition {parse_expression()};
    auto body {parse_block()};
    auto main_case = std::make_unique<IfCase>(std::move(condition), std::move(body));
    cases.push_back(std::move(main_case));

    // Parse optional else if statements
    while(reader.check_type(Type::ELSEIF) == 1) {
        reader.get_token();

        auto elseif_condition {parse_expression()};
        auto elseif_body {parse_block()};
        auto elseif_case = std::make_unique<IfCase>(std::move(elseif_condition), std::move(elseif_body));
        cases.push_back(std::move(elseif_case));
    }

    // Parse optional else statement
    std::unique_ptr<Block> else_body {nullptr};
    if (reader.check_type(Type::ELSE) == 1){
        reader.get_token();

        else_body = parse_block();
    }


    auto if_condition = std::make_unique<IfStatement>(std::move(cases), std::move(else_body));

    return if_condition;
}